

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorPool::Tables::Tables(Tables *this)

{
  allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_> local_22;
  streq local_21;
  hash<const_char_*> local_20;
  allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_> local_1f;
  streq local_1e;
  hash<const_char_*> local_1d [13];
  Tables *local_10;
  Tables *this_local;
  
  local_10 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->pending_files_);
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::hash_set(&this->known_bad_files_,3);
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::hash_set(&this->known_bad_symbols_,3);
  hash_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>_>
  ::hash_set(&this->extensions_loaded_from_db_,3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  ::vector(&this->strings_);
  std::vector<google::protobuf::Message_*,_std::allocator<google::protobuf::Message_*>_>::vector
            (&this->messages_);
  std::
  vector<google::protobuf::GoogleOnceDynamic_*,_std::allocator<google::protobuf::GoogleOnceDynamic_*>_>
  ::vector(&this->once_dynamics_);
  std::
  vector<google::protobuf::FileDescriptorTables_*,_std::allocator<google::protobuf::FileDescriptorTables_*>_>
  ::vector(&this->file_tables_);
  std::vector<void_*,_std::allocator<void_*>_>::vector(&this->allocations_);
  std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>::allocator(&local_1f);
  hash_map<const_char_*,_google::protobuf::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>_>
  ::hash_map(&this->symbols_by_name_,3,local_1d,&local_1e,&local_1f);
  std::allocator<std::pair<const_char_*const,_google::protobuf::Symbol>_>::~allocator(&local_1f);
  std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>::allocator
            (&local_22);
  hash_map<const_char_*,_const_google::protobuf::FileDescriptor_*,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>_>
  ::hash_map(&this->files_by_name_,3,&local_20,&local_21,&local_22);
  std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>::
  ~allocator(&local_22);
  std::
  map<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::map(&this->extensions_);
  std::
  vector<google::protobuf::DescriptorPool::Tables::CheckPoint,_std::allocator<google::protobuf::DescriptorPool::Tables::CheckPoint>_>
  ::vector(&this->checkpoints_);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->symbols_after_checkpoint_)
  ;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->files_after_checkpoint_);
  std::
  vector<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
  ::vector(&this->extensions_after_checkpoint_);
  return;
}

Assistant:

DescriptorPool::Tables::Tables()
    // Start some hash_map and hash_set objects with a small # of buckets
    : known_bad_files_(3),
      known_bad_symbols_(3),
      extensions_loaded_from_db_(3),
      symbols_by_name_(3),
      files_by_name_(3) {}